

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void rw::Frame::syncDirty(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  
  puVar5 = *(undefined8 **)(engine + 0x10);
  while (lVar3 = engine, puVar1 = (undefined8 *)(engine + 0x10), puVar5 != puVar1) {
    puVar1 = (undefined8 *)*puVar5;
    if ((*(byte *)((long)puVar5 + -0xd) & 1) == 0) {
      puVar4 = (undefined8 *)puVar5[2];
      while (puVar4 != puVar5 + 2) {
        puVar2 = (undefined8 *)*puVar4;
        (*(code *)puVar4[2])(puVar4 + -2);
        puVar4 = puVar2;
      }
      syncObjRecurse((Frame *)puVar5[0x14]);
    }
    else {
      if ((*(byte *)((long)puVar5 + -0xd) & 4) != 0) {
        puVar5[0x12] = puVar5[10];
        puVar5[0x13] = puVar5[0xb];
        puVar5[0x10] = puVar5[8];
        puVar5[0x11] = puVar5[9];
        puVar5[0xe] = puVar5[6];
        puVar5[0xf] = puVar5[7];
        puVar5[0xc] = puVar5[4];
        puVar5[0xd] = puVar5[5];
      }
      puVar4 = (undefined8 *)puVar5[2];
      while (puVar4 != puVar5 + 2) {
        puVar2 = (undefined8 *)*puVar4;
        (*(code *)puVar4[2])(puVar4 + -2);
        puVar4 = puVar2;
      }
      syncRecurse((Frame *)puVar5[0x14],*(uint8 *)((long)puVar5 + -0xd));
    }
    *(byte *)((long)puVar5 + -0xd) = *(byte *)((long)puVar5 + -0xd) & 0xf0;
    puVar5 = puVar1;
  }
  *(undefined8 **)(engine + 0x10) = puVar1;
  *(undefined8 **)(lVar3 + 0x18) = puVar1;
  return;
}

Assistant:

void
Frame::syncDirty(void)
{
	Frame *frame;
	FORLIST(lnk, engine->frameDirtyList){
		frame = LLLinkGetData(lnk, Frame, inDirtyList);
		if(frame->object.privateFlags & Frame::HIERARCHYSYNCLTM){
			// Sync root's LTM
			if(frame->object.privateFlags & Frame::SUBTREESYNCLTM)
				frame->ltm = frame->matrix;
			// Synch attached objects
			FORLIST(lnk, frame->objectList)
				ObjectWithFrame::fromFrame(lnk)->sync();
			// ...and children
			syncRecurse(frame->child, frame->object.privateFlags);
		}else{
			// LTMs are clean, just synch objects
			FORLIST(lnk, frame->objectList)
				ObjectWithFrame::fromFrame(lnk)->sync();
			syncObjRecurse(frame->child);
		}
		// all clean now
		frame->object.privateFlags &= ~(Frame::SYNCLTM | Frame::SYNCOBJ);
	}
	engine->frameDirtyList.init();
}